

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O1

Vec_Int_t * Gia_PolynReorder(Gia_Man_t *pGia,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  Vec_Int_t *vFadds;
  Vec_Int_t *vHadds;
  Vec_Int_t *__ptr;
  Vec_Int_t *vNodes;
  int *piVar6;
  Vec_Int_t *pVVar7;
  char *__function;
  int iVar8;
  long lVar9;
  uint iObj;
  int iVar10;
  char *__file;
  char *__assertion;
  long lVar11;
  uint uVar12;
  
  vFadds = Gia_ManDetectFullAdders(pGia,fVeryVerbose);
  vHadds = Gia_ManDetectHalfAdders(pGia,fVeryVerbose);
  __ptr = Gia_PolynFindOrder(pGia,vFadds,vHadds,fVerbose,fVeryVerbose);
  iVar1 = pGia->nObjs;
  uVar12 = ~(pGia->vCos->nSize + pGia->vCis->nSize);
  iVar8 = iVar1 + uVar12;
  vNodes = (Vec_Int_t *)malloc(0x10);
  if ((iVar1 + uVar12) - 1 < 0xf) {
    iVar8 = 0x10;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  vNodes->pArray = piVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar7->pArray = piVar6;
  pVVar7->nSize = iVar1;
  memset(piVar6,0,(long)iVar1 << 2);
  Gia_ManIncrementTravId(pGia);
  if (0 < __ptr->nSize) {
    lVar9 = 0;
    do {
      uVar12 = __ptr->pArray[lVar9];
      if ((int)uVar12 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0x100,"int Abc_Lit2Var2(int)");
      }
      iObj = uVar12 >> 2;
      if ((uVar12 & 3) == 1) {
        uVar5 = iObj * 2;
        uVar12 = vHadds->nSize;
        if (uVar12 == uVar5 || SBORROW4(uVar12,uVar5) != (int)(uVar12 + iObj * -2) < 0) {
LAB_005deb2d:
          __assertion = "i >= 0 && i < p->nSize";
          __file = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
          ;
          __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
          goto LAB_005deb42;
        }
        piVar3 = vHadds->pArray;
        lVar11 = 0;
        do {
          Gia_ManCollectAnds_rec(pGia,piVar3[(ulong)uVar5 + lVar11],vNodes);
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
      }
      else if ((uVar12 & 3) == 2) {
        if (vFadds->nSize <= (int)(iObj * 5)) goto LAB_005deb2d;
        piVar3 = vFadds->pArray;
        lVar11 = 0;
        do {
          Gia_ManCollectAnds_rec(pGia,piVar3[(ulong)iObj * 5 + lVar11 + 3],vNodes);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 2);
      }
      else {
        Gia_ManCollectAnds_rec(pGia,iObj,vNodes);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < __ptr->nSize);
  }
  pVVar4 = pGia->vCis;
  if (0 < pVVar4->nSize) {
    piVar3 = pVVar4->pArray;
    lVar9 = 0;
    do {
      iVar8 = piVar3[lVar9];
      if (((long)iVar8 < 0) || (pGia->nObjs <= iVar8)) {
        __assertion = "v >= 0 && v < p->nObjs";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_005deb42:
        __assert_fail(__assertion,__file,0x1af,__function);
      }
      if (iVar8 == 0) break;
      if (iVar1 <= iVar8) goto LAB_005dead8;
      lVar9 = lVar9 + 1;
      piVar6[iVar8] = (int)lVar9;
    } while (lVar9 < pVVar4->nSize);
  }
  iVar8 = vNodes->nSize;
  if (0 < (long)iVar8) {
    piVar3 = vNodes->pArray;
    lVar9 = 0;
    do {
      iVar2 = piVar3[lVar9];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_005dead8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      iVar10 = (int)lVar9;
      lVar9 = lVar9 + 1;
      piVar6[iVar2] = pVVar4->nSize + iVar10 + 1;
    } while (iVar8 != lVar9);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (vFadds->pArray != (int *)0x0) {
    free(vFadds->pArray);
    vFadds->pArray = (int *)0x0;
  }
  if (vFadds != (Vec_Int_t *)0x0) {
    free(vFadds);
  }
  if (vHadds->pArray != (int *)0x0) {
    free(vHadds->pArray);
    vHadds->pArray = (int *)0x0;
  }
  if (vHadds != (Vec_Int_t *)0x0) {
    free(vHadds);
  }
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (int *)0x0;
  }
  free(vNodes);
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_PolynReorder( Gia_Man_t * pGia, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vFadds  = Gia_ManDetectFullAdders( pGia, fVeryVerbose );
    Vec_Int_t * vHadds  = Gia_ManDetectHalfAdders( pGia, fVeryVerbose );
    Vec_Int_t * vRecord = Gia_PolynFindOrder( pGia, vFadds, vHadds, fVerbose, fVeryVerbose );
    Vec_Int_t * vOrder  = Vec_IntAlloc( Gia_ManAndNum(pGia) );
    Vec_Int_t * vOrder2 = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, Entry;

    // collect nodes
    Gia_ManIncrementTravId( pGia );
    Vec_IntForEachEntry( vRecord, Entry, i )
    {
        int Node = Abc_Lit2Var2(Entry);
        int Attr = Abc_Lit2Att2(Entry);
        if ( Attr == 2 )
        {
            int * pFanins = Vec_IntEntryP( vFadds, 5*Node );
            for ( k = 3; k < 5; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else if ( Attr == 1 )
        {
            int * pFanins = Vec_IntEntryP( vHadds, 2*Node );
            for ( k = 0; k < 2; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else
            Gia_ManCollectAnds_rec( pGia, Node, vOrder );
        //printf( "Order = %d.  Node = %d.  Size = %d ", i, Node, Vec_IntSize(vOrder) );
    }
    //printf( "\n" );
    //assert( Vec_IntSize(vOrder) == Gia_ManAndNum(pGia) );

    // remap order
    Gia_ManForEachCiId( pGia, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+i );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+Gia_ManCiNum(pGia)+i );
    //Vec_IntPrint( vOrder );

    Vec_IntFree( vRecord );
    Vec_IntFree( vFadds );
    Vec_IntFree( vHadds );
    Vec_IntFree( vOrder );
    return vOrder2;
}